

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::swap(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
       *this,robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             *other)

{
  hash<unsigned_long> *in_RSI;
  hash<unsigned_long> *in_RDI;
  
  std::swap<std::hash<unsigned_long>>(in_RDI,in_RSI);
  std::swap<std::equal_to<unsigned_long>>
            ((equal_to<unsigned_long> *)in_RDI,(equal_to<unsigned_long> *)in_RSI);
  std::swap<tsl::rh::power_of_two_growth_policy<2ul>>
            ((power_of_two_growth_policy<2UL> *)in_RDI,(power_of_two_growth_policy<2UL> *)in_RSI);
  std::
  swap<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,double>,false>,std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,double>,false>>>
            ((vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
              *)in_RSI,
             (vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
              *)in_RDI);
  std::swap<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,double>,false>*>
            ((bucket_entry<std::pair<unsigned_long,_double>,_false> **)
             ((equal_to<unsigned_long> *)in_RDI + 0x20),
             (bucket_entry<std::pair<unsigned_long,_double>,_false> **)
             ((equal_to<unsigned_long> *)in_RSI + 0x20));
  std::swap<unsigned_long>
            ((unsigned_long *)((equal_to<unsigned_long> *)in_RDI + 0x28),
             (unsigned_long *)((equal_to<unsigned_long> *)in_RSI + 0x28));
  std::swap<unsigned_long>
            ((unsigned_long *)((equal_to<unsigned_long> *)in_RDI + 0x30),
             (unsigned_long *)((equal_to<unsigned_long> *)in_RSI + 0x30));
  std::swap<unsigned_long>
            ((unsigned_long *)((equal_to<unsigned_long> *)in_RDI + 0x38),
             (unsigned_long *)((equal_to<unsigned_long> *)in_RSI + 0x38));
  std::swap<float>((float *)((equal_to<unsigned_long> *)in_RDI + 0x40),
                   (float *)((equal_to<unsigned_long> *)in_RSI + 0x40));
  std::swap<float>((float *)((equal_to<unsigned_long> *)in_RDI + 0x44),
                   (float *)((equal_to<unsigned_long> *)in_RSI + 0x44));
  std::swap<bool>((bool *)((equal_to<unsigned_long> *)in_RDI + 0x48),
                  (bool *)((equal_to<unsigned_long> *)in_RSI + 0x48));
  std::swap<bool>((bool *)((equal_to<unsigned_long> *)in_RDI + 0x49),
                  (bool *)((equal_to<unsigned_long> *)in_RSI + 0x49));
  return;
}

Assistant:

void swap(robin_hash& other) {
    using std::swap;

    swap(static_cast<Hash&>(*this), static_cast<Hash&>(other));
    swap(static_cast<KeyEqual&>(*this), static_cast<KeyEqual&>(other));
    swap(static_cast<GrowthPolicy&>(*this), static_cast<GrowthPolicy&>(other));
    swap(m_buckets_data, other.m_buckets_data);
    swap(m_buckets, other.m_buckets);
    swap(m_bucket_count, other.m_bucket_count);
    swap(m_nb_elements, other.m_nb_elements);
    swap(m_load_threshold, other.m_load_threshold);
    swap(m_min_load_factor, other.m_min_load_factor);
    swap(m_max_load_factor, other.m_max_load_factor);
    swap(m_grow_on_next_insert, other.m_grow_on_next_insert);
    swap(m_try_shrink_on_next_insert, other.m_try_shrink_on_next_insert);
  }